

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

void __thiscall
DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::RemoveElement<Memory::HeapAllocator>
          (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *this,
          HeapAllocator *allocator,GuestArenaAllocator *element)

{
  void *pvVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  void **obj;
  
  obj = &element[-1].super_ArenaAllocator.
         super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList;
  bVar3 = HasNode(this,(NodeBase *)obj);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x175,"(HasNode(node))","HasNode(node)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pvVar1 = *obj;
  **(long **)&element[-1].pendingDelete = (long)pvVar1;
  *(undefined8 *)((long)pvVar1 + 8) = *(undefined8 *)&element[-1].pendingDelete;
  Memory::
  DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,DListNode<Memory::Recycler::GuestArenaAllocator>>
            (allocator,(DListNode<Memory::Recycler::GuestArenaAllocator> *)obj);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveElement(TAllocator * allocator, TData * element)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, node);

        this->DecrementCount();

    }